

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdPlugin.c
# Opt level: O2

Vec_Str_t * Abc_ManReadFile(char *pFileName)

{
  int iVar1;
  FILE *__stream;
  Vec_Str_t *p;
  
  __stream = fopen(pFileName,"r");
  if (__stream == (FILE *)0x0) {
    p = (Vec_Str_t *)0x0;
    printf("Cannot open file \"%s\".\n",pFileName);
  }
  else {
    p = Vec_StrAlloc(100);
    while( true ) {
      iVar1 = fgetc(__stream);
      if (iVar1 == -1) break;
      Vec_StrPush(p,(char)iVar1);
    }
    Vec_StrPush(p,'\0');
    fclose(__stream);
  }
  return p;
}

Assistant:

Vec_Str_t * Abc_ManReadFile( char * pFileName )
{
    FILE * pFile;
    Vec_Str_t * vStr;
    int c;
    pFile = fopen( pFileName, "r" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\".\n", pFileName );
        return NULL;
    }
    vStr = Vec_StrAlloc( 100 );
    while ( (c = fgetc(pFile)) != EOF )
        Vec_StrPush( vStr, (char)c );
    Vec_StrPush( vStr, '\0' );
    fclose( pFile );
    return vStr;
}